

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::startInLoop(Connector *this)

{
  LogLevel LVar1;
  LogStream *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  Connector *local_10;
  Connector *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state != kDisconnected) {
    __assert_fail("m_state == kDisconnected",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                  ,0x2c,"void sznet::net::Connector::startInLoop()");
  }
  if ((this->m_connect & 1U) == 0) {
    LVar1 = Logger::logLevel();
    if ((int)LVar1 < 2) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_ff0,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_ff0._0_8_;
      file.m_size = local_ff0._8_4_;
      Logger::Logger(&local_fe0,file,0x33,DEBUG,"startInLoop");
      this_00 = Logger::stream(&local_fe0);
      LogStream::operator<<(this_00,"do not connect");
      Logger::~Logger(&local_fe0);
    }
  }
  else {
    connect(this,in_ESI,__addr,in_ECX);
  }
  return;
}

Assistant:

void Connector::startInLoop()
{
	m_loop->assertInLoopThread();
	assert(m_state == kDisconnected);
	if (m_connect)
	{
		connect();
	}
	else
	{
		LOG_DEBUG << "do not connect";
	}
}